

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_bolt(game_event_type type,wchar_t proj_type,_Bool drawing,_Bool seen,_Bool beam,
                      wchar_t oy,wchar_t ox,wchar_t y,wchar_t x)

{
  undefined1 local_48 [8];
  game_event_data data;
  wchar_t oy_local;
  _Bool beam_local;
  _Bool seen_local;
  game_event_type gStack_c;
  _Bool drawing_local;
  wchar_t proj_type_local;
  game_event_type type_local;
  
  data.point.y = ox;
  data.message.type = y;
  data.bolt.ox = x;
  local_48._0_4_ = proj_type;
  local_48[4] = drawing;
  local_48[5] = seen;
  local_48[6] = beam;
  data.point.x = oy;
  data.explosion.centre.x = oy;
  data.explosion.centre.y._1_1_ = beam;
  data.explosion.centre.y._2_1_ = seen;
  data.explosion.centre.y._3_1_ = drawing;
  oy_local = proj_type;
  gStack_c = type;
  game_event_dispatch(type,(game_event_data *)local_48);
  return;
}

Assistant:

void event_signal_bolt(game_event_type type,
					   int proj_type,
					   bool drawing,
					   bool seen,
					   bool beam,
					   int oy,
					   int ox,
					   int y,
					   int x)
{
	game_event_data data;
	data.bolt.proj_type = proj_type;
	data.bolt.drawing = drawing;
	data.bolt.seen = seen;
	data.bolt.beam = beam;
	data.bolt.oy = oy;
	data.bolt.ox = ox;
	data.bolt.y = y;
	data.bolt.x = x;

	game_event_dispatch(type, &data);
}